

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Derive.cpp
# Opt level: O2

DeriveRec * __thiscall amrex::DeriveList::get(DeriveList *this,string *name)

{
  __type _Var1;
  _List_node_base *p_Var2;
  const_iterator End;
  
  p_Var2 = (_List_node_base *)this;
  do {
    p_Var2 = (((list<amrex::DeriveRec,_std::allocator<amrex::DeriveRec>_> *)&p_Var2->_M_next)->
             super__List_base<amrex::DeriveRec,_std::allocator<amrex::DeriveRec>_>)._M_impl._M_node.
             super__List_node_base._M_next;
    if (p_Var2 == (_List_node_base *)this) {
      return (DeriveRec *)0x0;
    }
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (p_Var2 + 1),name);
  } while (!_Var1);
  return (DeriveRec *)(p_Var2 + 1);
}

Assistant:

const DeriveRec*
DeriveList::get (const std::string& name) const
{
    for (std::list<DeriveRec>::const_iterator li = lst.begin(), End = lst.end();
         li != End;
         ++li)
    {
        if (li->derive_name == name)
            return &(*li);
    }
    return 0;
}